

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O2

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  impl_base *piVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  function_view fVar4;
  allocator<void> local_f1;
  function local_f0;
  undefined1 local_e8 [32];
  error_category *peStack_c8;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor,_void>
  w;
  ptr local_80;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_std::error_code>
  local_68;
  ptr local_40;
  
  local_80.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
                *)base;
  local_80.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_asio::any_io_executor>
                *)base;
  execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor((any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&w,(any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                        *)(base + 3));
  local_e8._0_8_ = base[2].next_;
  local_e8._8_8_ = base[2].func_;
  base[2].func_ = (func_type)0x0;
  base[2].next_ = (scheduler_operation *)0x0;
  local_e8._16_4_ = base[2].task_result_;
  local_e8._24_8_ = base[1].next_;
  peStack_c8 = (error_category *)base[1].func_;
  local_80.h = (type *)local_e8;
  ptr::reset(&local_80);
  if (owner != (void *)0x0) {
    if (w.
        super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
        .executor_.
        super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
        .super_any_executor_base.target_ == (void *)0x0) {
      binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_std::error_code>
      ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_std::error_code>
                    *)local_e8);
    }
    else if ((w.
              super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
              .executor_.
              super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
              .super_any_executor_base.target_fns_)->blocking_execute ==
             (_func_void_any_executor_base_ptr_function_view *)0x0) {
      p_Var1 = (w.
                super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                .executor_.
                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                .super_any_executor_base.target_fns_)->execute;
      binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_std::error_code>
      ::binder1(&local_68,
                (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_std::error_code>
                 *)local_e8);
      local_40.a = &local_f1;
      if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
      }
      piVar2 = (impl_base *)
               thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                         (uVar3,0x38,8);
      local_40.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_std::error_code>,_std::allocator<void>_>
                    *)0x0;
      binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_std::error_code>
      ::binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:94:30),_std::error_code>
                 *)(piVar2 + 1),&local_68);
      piVar2->complete_ =
           executor_function::
           complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>,std::allocator<void>>
      ;
      local_40.v = (void *)0x0;
      local_f0.impl_ = piVar2;
      executor_function::
      impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:94:30),_std::error_code>,_std::allocator<void>_>
      ::ptr::reset(&local_40);
      (*p_Var1)((any_executor_base *)&w,&local_f0);
      executor_function::~executor_function(&local_f0);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.handler_.ptr.
                  super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      fVar4.function_ = local_e8;
      fVar4.complete_ =
           executor_function_view::
           complete<asio::detail::binder1<helics::MessageTimer::updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>>
      ;
      (*(w.
         super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
         .executor_.
         super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
         .super_any_executor_base.target_fns_)->blocking_execute)((any_executor_base *)&w,fVar4);
    }
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
  execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&w);
  ptr::reset(&local_80);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }